

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmstrbuf.cpp
# Opt level: O2

int __thiscall
CVmObjStringBuffer::getp_splice
          (CVmObjStringBuffer *this,vm_obj_id_t self,vm_val_t *retval,uint *argc)

{
  vm_val_t *pvVar1;
  int iVar2;
  int del_chars;
  ushort *puVar3;
  int iVar4;
  vm_val_t strval;
  
  if (getp_splice(unsigned_int,vm_val_t*,unsigned_int*)::desc == '\0') {
    iVar2 = __cxa_guard_acquire(&getp_splice(unsigned_int,vm_val_t*,unsigned_int*)::desc);
    if (iVar2 != 0) {
      getp_splice::desc.min_argc_ = 3;
      getp_splice::desc.opt_argc_ = 0;
      getp_splice::desc.varargs_ = 0;
      __cxa_guard_release(&getp_splice(unsigned_int,vm_val_t*,unsigned_int*)::desc);
    }
  }
  iVar2 = CVmObject::get_prop_check_argc(retval,argc,&getp_splice::desc);
  if (iVar2 == 0) {
    iVar2 = CVmBif::pop_int_val();
    if (iVar2 < 0) {
      iVar4 = *(int *)(this->super_CVmObject).ext_;
    }
    else {
      iVar4 = -1;
    }
    del_chars = CVmBif::pop_int_val();
    puVar3 = (ushort *)vm_val_t::cast_to_string(sp_ + -1,&strval);
    pvVar1 = sp_;
    pvVar1[-1].typ = strval.typ;
    *(undefined4 *)&pvVar1[-1].field_0x4 = strval._4_4_;
    pvVar1[-1].val = strval.val;
    splice_text(this,self,iVar4 + iVar2,del_chars,(char *)(puVar3 + 1),(uint)*puVar3,1);
    sp_ = sp_ + -1;
    retval->typ = VM_OBJ;
    (retval->val).obj = self;
  }
  return 1;
}

Assistant:

int CVmObjStringBuffer::getp_splice(VMG_ vm_obj_id_t self,
                                    vm_val_t *retval, uint *argc)
{
    /* check arguments */
    static CVmNativeCodeDesc desc(3);
    if (get_prop_check_argc(retval, argc, &desc))
        return TRUE;

    /* pop the insertion index and adjust to 0-based or end-based */
    int32_t idx = CVmBif::pop_int_val(vmg0_);
    idx += (idx < 0 ? get_ext()->len : -1);

    /* pop the deletion length */
    int32_t del = CVmBif::pop_int_val(vmg0_);

    /* get or cast the string; leave it on the stack for gc protection */
    vm_val_t strval;
    const char *str = G_stk->get(0)->cast_to_string(vmg_ &strval);
    *G_stk->get(0) = strval;

    /* do the insert */
    splice_text(vmg_ self, idx, del, str + VMB_LEN, vmb_get_len(str), TRUE);

    /* discard gc protection */
    G_stk->discard();

    /* handled */
    retval->set_obj(self);
    return TRUE;
}